

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O3

void __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::insert_heap
          (clusterizer<crnlib::vec<2U,_float>_> *this,uint node_index)

{
  vector<unsigned_int> *this_00;
  float fVar1;
  uint uVar2;
  uint *puVar3;
  vq_node *pvVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint min_new_capacity;
  
  fVar1 = (this->m_nodes).m_p[node_index].m_variance;
  uVar2 = this->m_heap_size;
  uVar8 = uVar2 + 1;
  uVar7 = (ulong)uVar8;
  this->m_heap_size = uVar8;
  this_00 = &this->m_heap;
  uVar6 = (this->m_heap).m_size;
  if ((uVar6 <= uVar8) && (min_new_capacity = uVar2 + 2, uVar6 != min_new_capacity)) {
    if (uVar6 <= min_new_capacity) {
      if ((this->m_heap).m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,min_new_capacity,uVar6 == uVar8,4,(object_mover)0x0,
                   false);
        uVar6 = (this->m_heap).m_size;
      }
      memset(this_00->m_p + uVar6,0,(ulong)(min_new_capacity - uVar6) << 2);
    }
    (this->m_heap).m_size = min_new_capacity;
  }
  puVar3 = this_00->m_p;
  if (1 < uVar8) {
    pvVar4 = (this->m_nodes).m_p;
    do {
      uVar5 = uVar7 >> 1;
      if (fVar1 < pvVar4[puVar3[uVar5]].m_variance) break;
      uVar8 = (uint)uVar7;
      puVar3[uVar7] = puVar3[uVar5];
      uVar7 = uVar5;
    } while (3 < uVar8);
  }
  puVar3[uVar7] = node_index;
  return;
}

Assistant:

void insert_heap(uint node_index)
        {
            const float variance = m_nodes[node_index].m_variance;
            uint pos = ++m_heap_size;

            if (m_heap_size >= m_heap.size())
            {
                m_heap.resize(m_heap_size + 1);
            }

            for (;;)
            {
                uint parent = pos >> 1;
                if (!parent)
                {
                    break;
                }

                float parent_variance = m_nodes[m_heap[parent]].m_variance;
                if (parent_variance > variance)
                {
                    break;
                }

                m_heap[pos] = m_heap[parent];

                pos = parent;
            }

            m_heap[pos] = node_index;
        }